

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_copy(lua_State *L,int fromidx,int toidx)

{
  byte bVar1;
  GCObject *o;
  TValue *io1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *io2;
  
  pTVar2 = index2value(L,fromidx);
  pTVar3 = index2value(L,toidx);
  pTVar3->value_ = pTVar2->value_;
  bVar1 = pTVar2->tt_;
  pTVar3->tt_ = bVar1;
  if ((((bVar1 & 0x40) != 0 && toidx < -0xf4628) &&
      (o = *(GCObject **)(L->ci->func).p, (o->marked & 0x20) != 0)) &&
     ((((pTVar2->value_).gc)->marked & 0x18) != 0)) {
    luaC_barrier_(L,o,(pTVar2->value_).gc);
    return;
  }
  return;
}

Assistant:

LUA_API void lua_copy (lua_State *L, int fromidx, int toidx) {
  TValue *fr, *to;
  lua_lock(L);
  fr = index2value(L, fromidx);
  to = index2value(L, toidx);
  api_check(L, isvalid(L, to), "invalid index");
  setobj(L, to, fr);
  if (isupvalue(toidx))  /* function upvalue? */
    luaC_barrier(L, clCvalue(s2v(L->ci->func.p)), fr);
  /* LUA_REGISTRYINDEX does not need gc barrier
     (collector revisits it before finishing collection) */
  lua_unlock(L);
}